

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O2

void __thiscall tetgenio::save_edges(tetgenio *this,char *filebasename)

{
  FILE *__stream;
  long lVar1;
  char outedgefilename [1024];
  
  sprintf(outedgefilename,"%s.edge",filebasename);
  printf("Saving edges to %s\n",outedgefilename);
  __stream = fopen(outedgefilename,"w");
  fprintf(__stream,"%d  %d\n",(ulong)(uint)this->numberofedges,
          (ulong)(this->edgemarkerlist != (int *)0x0));
  for (lVar1 = 0; lVar1 < this->numberofedges; lVar1 = lVar1 + 1) {
    fprintf(__stream,"%d  %4d  %4d",(ulong)(uint)(this->firstnumber + (int)lVar1),
            (ulong)(uint)this->edgelist[lVar1 * 2],(ulong)(uint)this->edgelist[lVar1 * 2 + 1]);
    if (this->edgemarkerlist != (int *)0x0) {
      fprintf(__stream,"  %d",(ulong)(uint)this->edgemarkerlist[lVar1]);
    }
    fputc(10,__stream);
  }
  fclose(__stream);
  return;
}

Assistant:

void tetgenio::save_edges(char* filebasename)
{
  FILE *fout;
  char outedgefilename[FILENAMESIZE];
  int i;

  sprintf(outedgefilename, "%s.edge", filebasename);
  printf("Saving edges to %s\n", outedgefilename);
  fout = fopen(outedgefilename, "w");
  fprintf(fout, "%d  %d\n", numberofedges, edgemarkerlist != NULL ? 1 : 0);
  for (i = 0; i < numberofedges; i++) {
    fprintf(fout, "%d  %4d  %4d", i + firstnumber, edgelist[i * 2],
            edgelist[i * 2 + 1]);
    if (edgemarkerlist != NULL) {
      fprintf(fout, "  %d", edgemarkerlist[i]);
    }
    fprintf(fout, "\n");
  }

  fclose(fout);
}